

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
::find_or_prepare_insert_non_soo<google::protobuf::FileDescriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
          *this,FileDescriptor **key)

{
  ulong uVar1;
  uint uVar2;
  ushort uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  undefined1 uVar20;
  bool bVar21;
  ushort uVar22;
  ctrl_t *pcVar23;
  ctrl_t *pcVar24;
  slot_type *ppFVar25;
  ctrl_t *pcVar26;
  size_t sVar27;
  anon_union_8_1_a8a14541_for_iterator_2 aVar28;
  PolicyFunctions *in_R9;
  ulong uVar29;
  size_t cap;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  CommonFields *common;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  iterator iVar40;
  FindInfo target;
  __m128i match;
  ctrl_t cVar33;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  
  if (*(long *)this == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>, K = const google::protobuf::FileDescriptor *]"
                 );
  }
  if (*(long *)this == 0) {
LAB_00192735:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)this);
  uVar1 = *(ulong *)this;
  if ((uVar1 + 1 & uVar1) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar32 = ((ulong)*key ^ 0x463ad8) * -0x234dd359734ecb13;
  uVar32 = ((uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 |
             (uVar32 & 0xff0000000000) >> 0x18 | (uVar32 & 0xff00000000) >> 8 |
             (uVar32 & 0xff000000) << 8 | (uVar32 & 0xff0000) << 0x18 | (uVar32 & 0xff00) << 0x28 |
            uVar32 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 | (uVar32 & 0xff0000000000) >> 0x18
            | (uVar32 & 0xff00000000) >> 8 | (uVar32 & 0xff000000) << 8 |
            (uVar32 & 0xff0000) << 0x18 | (uVar32 & 0xff00) << 0x28 | uVar32 << 0x38);
  uVar29 = ((ulong)common >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar1;
  pcVar23 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       *)this);
  uVar20 = (undefined1)(uVar32 >> 0x38);
  auVar34 = ZEXT216(CONCAT11(uVar20,uVar20) & 0x7f7f);
  auVar34 = pshuflw(auVar34,auVar34,0);
  iVar40 = __return_storage_ptr__->first;
  bVar21 = __return_storage_ptr__->second;
  uVar32 = 0;
  do {
    aVar28 = iVar40.field_1;
    pcVar24 = iVar40.ctrl_;
    pcVar26 = pcVar23 + uVar29;
    cVar4 = *pcVar26;
    cVar5 = pcVar26[1];
    cVar6 = pcVar26[2];
    cVar7 = pcVar26[3];
    cVar8 = pcVar26[4];
    cVar9 = pcVar26[5];
    cVar10 = pcVar26[6];
    cVar11 = pcVar26[7];
    cVar12 = pcVar26[8];
    cVar13 = pcVar26[9];
    cVar14 = pcVar26[10];
    cVar15 = pcVar26[0xb];
    cVar16 = pcVar26[0xc];
    cVar17 = pcVar26[0xd];
    cVar18 = pcVar26[0xe];
    cVar19 = pcVar26[0xf];
    cVar33 = auVar34[0];
    auVar35[0] = -(cVar33 == cVar4);
    cVar36 = auVar34[1];
    auVar35[1] = -(cVar36 == cVar5);
    cVar37 = auVar34[2];
    auVar35[2] = -(cVar37 == cVar6);
    cVar38 = auVar34[3];
    auVar35[3] = -(cVar38 == cVar7);
    auVar35[4] = -(cVar33 == cVar8);
    auVar35[5] = -(cVar36 == cVar9);
    auVar35[6] = -(cVar37 == cVar10);
    auVar35[7] = -(cVar38 == cVar11);
    auVar35[8] = -(cVar33 == cVar12);
    auVar35[9] = -(cVar36 == cVar13);
    auVar35[10] = -(cVar37 == cVar14);
    auVar35[0xb] = -(cVar38 == cVar15);
    auVar35[0xc] = -(cVar33 == cVar16);
    auVar35[0xd] = -(cVar36 == cVar17);
    auVar35[0xe] = -(cVar37 == cVar18);
    auVar35[0xf] = -(cVar38 == cVar19);
    uVar22 = (ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe | (ushort)(auVar35[0xf] >> 7) << 0xf;
    uVar31 = (uint)uVar22;
    while (uVar22 != 0) {
      uVar2 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      ppFVar25 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               *)this);
      uVar30 = uVar2 + uVar29 & uVar1;
      if (ppFVar25[uVar30] == *key) {
        (__return_storage_ptr__->first).field_1 = aVar28;
        __return_storage_ptr__->second = bVar21;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        iVar40 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                *)this,uVar30);
        __return_storage_ptr__->first = iVar40;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      uVar22 = (ushort)(uVar31 - 1) & (ushort)uVar31;
      uVar31 = CONCAT22((short)(uVar31 - 1 >> 0x10),uVar22);
    }
    auVar39[0] = -(cVar4 == kEmpty);
    auVar39[1] = -(cVar5 == kEmpty);
    auVar39[2] = -(cVar6 == kEmpty);
    auVar39[3] = -(cVar7 == kEmpty);
    auVar39[4] = -(cVar8 == kEmpty);
    auVar39[5] = -(cVar9 == kEmpty);
    auVar39[6] = -(cVar10 == kEmpty);
    auVar39[7] = -(cVar11 == kEmpty);
    auVar39[8] = -(cVar12 == kEmpty);
    auVar39[9] = -(cVar13 == kEmpty);
    auVar39[10] = -(cVar14 == kEmpty);
    auVar39[0xb] = -(cVar15 == kEmpty);
    auVar39[0xc] = -(cVar16 == kEmpty);
    auVar39[0xd] = -(cVar17 == kEmpty);
    auVar39[0xe] = -(cVar18 == kEmpty);
    auVar39[0xf] = -(cVar19 == kEmpty);
    uVar22 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe | (ushort)(auVar39[0xf] >> 7) << 0xf;
    sVar27 = *(size_t *)this;
    if (uVar22 == 0) {
      if (sVar27 == 0) goto LAB_00192725;
      uVar30 = uVar32 + 0x10;
      if (sVar27 < uVar30) {
        (__return_storage_ptr__->first).field_1 = aVar28;
        __return_storage_ptr__->second = bVar21;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>, K = const google::protobuf::FileDescriptor *]"
                     );
      }
      uVar29 = uVar29 + uVar32 + 0x10 & uVar1;
    }
    else {
      if (sVar27 == 0) {
LAB_00192725:
        (__return_storage_ptr__->first).field_1 = aVar28;
        __return_storage_ptr__->second = bVar21;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        goto LAB_00192735;
      }
      pcVar26 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)this);
      bVar21 = ShouldInsertBackwardsForDebug(sVar27,(size_t)common,pcVar26);
      if (bVar21) {
        uVar3 = 0xf;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar31 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar31 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = uVar32;
      sVar27 = PrepareInsertNonSoo((container_internal *)this,common,uVar31 + uVar29 & uVar1,target,
                                   in_R9);
      iVar40 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              *)this,sVar27);
      bVar21 = true;
      uVar30 = uVar32;
    }
    uVar32 = uVar30;
    if (uVar22 != 0) {
      (__return_storage_ptr__->first).field_1 = iVar40.field_1;
      __return_storage_ptr__->second = bVar21;
      (__return_storage_ptr__->first).ctrl_ = iVar40.ctrl_;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }